

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O2

int Dau_DsdMergeStatus_rec(char *pStr,char **p,int *pMatches,int nShared,int *pStatus)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  undefined4 *puVar8;
  uint uVar9;
  
  pbVar4 = (byte *)*p;
  if (*pbVar4 == 0x21) {
    pStatus[(long)pbVar4 - (long)pStr] = -1;
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
  }
  lVar7 = (long)pbVar4 * 4 + (long)pStr * -4;
  while (bVar5 = *pbVar4, (byte)(bVar5 + 0xbf) < 6 || (byte)(bVar5 - 0x30) < 10) {
    *(undefined4 *)((long)pStatus + lVar7) = 0xffffffff;
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
    lVar7 = lVar7 + 4;
  }
  if (bVar5 == 0x3c) {
    bVar5 = 0x3c;
    if (pStr[(long)*(int *)((long)pMatches + lVar7) + 1] == '{') {
      puVar8 = (undefined4 *)(lVar7 + (long)pStatus);
      pbVar3 = (byte *)(pStr + (long)*(int *)((long)pMatches + lVar7) + 1);
      *p = (char *)pbVar3;
      for (; pbVar4 < pbVar3; pbVar4 = pbVar4 + 1) {
        *puVar8 = 0xffffffff;
        puVar8 = puVar8 + 1;
      }
      bVar5 = *pbVar3;
      pbVar4 = pbVar3;
      goto LAB_004353c9;
    }
  }
  else {
LAB_004353c9:
    if ((byte)(bVar5 + 0x9f) < 0x1a) {
      uVar6 = (uint)(nShared <= (int)(uint)(byte)(bVar5 + 0x9f)) * 3;
      lVar7 = (long)pbVar4 - (long)pStr;
      goto LAB_004354a3;
    }
    uVar6 = bVar5 - 0x3c;
    if (((0x3f < uVar6) || ((0x8000000080000001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
       (bVar5 != 0x28)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x157,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
  }
  lVar7 = (long)pbVar4 - (long)pStr;
  iVar1 = pMatches[lVar7];
  if ((uint)bVar5 + (uint)(bVar5 != 0x28) + 1 != (int)pStr[iVar1]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x143,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
  }
  uVar6 = 0;
  uVar9 = 0;
  while( true ) {
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
    if (pStr + iVar1 <= pbVar4) break;
    iVar2 = Dau_DsdMergeStatus_rec(pStr,p,pMatches,nShared,pStatus);
    uVar6 = uVar6 + (iVar2 == 3);
    uVar9 = uVar9 + 1;
    pbVar4 = (byte *)*p;
  }
  if (pbVar4 != (byte *)(pStr + iVar1)) {
    __assert_fail("*p == q",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x14a,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
  }
  if (uVar9 < 2) {
    __assert_fail("nTotal > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x14b,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
  }
  if (1 < uVar6) {
    if (uVar6 < uVar9) {
      uVar6 = 2;
    }
    else {
      if (uVar6 != uVar9) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x154,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
      }
      uVar6 = 3;
    }
  }
LAB_004354a3:
  pStatus[lVar7] = uVar6;
  return uVar6;
}

Assistant:

int Dau_DsdMergeStatus_rec( char * pStr, char ** p, int * pMatches, int nShared, int * pStatus )
{
    // none pure
    // 1 one pure
    // 2 two or more pure
    // 3 all pure
    if ( **p == '!' )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            for ( ; pTemp < q+1; pTemp++ )
                pStatus[pTemp - pStr] = -1;
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return pStatus[*p - pStr] = (**p - 'a' < nShared) ? 0 : 3;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Status, nPure = 0, nTotal = 0;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Status = Dau_DsdMergeStatus_rec( pStr, p, pMatches, nShared, pStatus );
            nPure += (Status == 3);
            nTotal++;
        }
        assert( *p == q );
        assert( nTotal > 1 );
        if ( nPure == 0 )
            Status = 0;
        else if ( nPure == 1 )
            Status = 1;
        else if ( nPure < nTotal )
            Status = 2;
        else if ( nPure == nTotal ) 
            Status = 3;
        else assert( 0 );
        return (pStatus[pOld - pStr] = Status);
    }
    assert( 0 );
    return 0;
}